

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O2

void SystemZ_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  sysz_reg sVar4;
  MCOperand *pMVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  int iStack_30;
  
  uVar3 = MCInst_getOpcode(MI);
  uVar3 = *(uint *)(printInstruction_OpInfo + (ulong)uVar3 * 4);
  SStream_concat0(O,(char *)((ulong)(uVar3 & 0xfff) + 0x38487f));
  switch(uVar3 >> 0xc & 0xf) {
  case 1:
    printOperand(MI,0,O);
    goto LAB_001bb402;
  case 2:
    printBDAddrOperand(MI,0,O);
    break;
  case 3:
    printU4ImmOperand(MI,0,O);
    break;
  case 4:
    iStack_30 = 0;
    goto LAB_001bb6f5;
  case 5:
    printCond4Operand(MI,1,O);
    SStream_concat0(O,anon_var_dwarf_73b07 + 0x11);
    goto switchD_001bb677_caseD_c;
  case 6:
    printCond4Operand(MI,2,O);
    SStream_concat0(O,anon_var_dwarf_73b07 + 0x11);
    printOperand(MI,0,O);
    break;
  case 7:
    pMVar5 = MCInst_getOperand(MI,0);
    uVar3 = MCOperand_getReg(pMVar5);
    pMVar5 = MCInst_getOperand(MI,1);
    uVar6 = MCOperand_getImm(pMVar5);
    pMVar5 = MCInst_getOperand(MI,2);
    uVar7 = MCOperand_getImm(pMVar5);
    pcVar8 = " + %lu";
    if (9 < uVar6) {
      pcVar8 = " + 0x%lx";
    }
    SStream_concat(O,pcVar8 + 3,uVar6);
    pcVar8 = "(%lu";
    if (9 < uVar7) {
      pcVar8 = "(0x%lx";
    }
    SStream_concat(O,pcVar8,uVar7);
    if (uVar3 != 0) {
      SStream_concat(O,", %%%s",
                     getRegisterName_AsmStrs +
                     *(uint *)(getRegisterName_RegAsmOffset + (ulong)(uVar3 - 1) * 4));
    }
    SStream_concat0(O,")");
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x16;
      puVar1[0] = '\x03';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      sVar4 = SystemZ_map_register(uVar3);
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x1e] = (uint8_t)sVar4;
      pcVar2 = MI->flat_insn->detail;
      *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x26) = uVar7;
      pcVar2 = MI->flat_insn->detail;
      *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x2e) = uVar6;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
      *puVar1 = *puVar1 + '\x01';
    }
    SStream_concat0(O,", ");
    goto switchD_001bb933_caseD_6;
  case 8:
    printCond4Operand(MI,5,O);
    SStream_concat0(O,anon_var_dwarf_73b07 + 0x11);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    goto switchD_001bb933_caseD_7;
  case 9:
    printCond4Operand(MI,3,O);
    SStream_concat0(O,anon_var_dwarf_73b07 + 0x11);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    iStack_30 = 1;
    goto LAB_001bb5f7;
  case 10:
    printCond4Operand(MI,4,O);
    SStream_concat0(O,anon_var_dwarf_73b07 + 0x11);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    iStack_30 = 1;
    goto LAB_001bb5a7;
  default:
    goto switchD_001bb2e6_default;
  }
  SStream_concat0(O,", ");
LAB_001bb402:
  switch(uVar3 >> 0x10 & 0xf) {
  case 1:
    printS8ImmOperand(MI,2,O);
    return;
  case 2:
    printOperand(MI,1,O);
    goto LAB_001bb655;
  case 3:
    goto switchD_001bb424_caseD_3;
  case 4:
    goto switchD_001bb2e6_default;
  case 5:
    goto switchD_001bb424_caseD_5;
  case 6:
    printS8ImmOperand(MI,1,O);
    break;
  case 7:
    goto switchD_001bb424_caseD_7;
  case 8:
    printU8ImmOperand(MI,1,O);
    break;
  case 9:
    printU8ImmOperand(MI,2,O);
    return;
  case 10:
    goto switchD_001bb424_caseD_a;
  default:
    SStream_concat0(O,", ");
LAB_001bb655:
    switch(uVar3 >> 0x14 & 0x1f) {
    case 1:
      printOperand(MI,2,O);
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bb2e6_default;
      case 2:
switchD_001bb74f_caseD_2:
        printU4ImmOperand(MI,2,O);
        goto switchD_001bb677_caseD_11;
      case 3:
        goto switchD_001bb677_caseD_c;
      }
switchD_001bb74f_caseD_1:
      SStream_concat0(O,", ");
      switch(uVar3 >> 0x1b & 0xf) {
      case 1:
        iStack_30 = 2;
        break;
      case 2:
        goto switchD_001bb74f_caseD_2;
      case 3:
        goto switchD_001bb677_caseD_c;
      case 4:
        iStack_30 = 4;
        goto LAB_001bba31;
      case 5:
        iStack_30 = 3;
LAB_001bba31:
        printU4ImmOperand(MI,iStack_30,O);
        return;
      case 6:
switchD_001bb933_caseD_6:
        iStack_30 = 3;
        goto LAB_001bb5a7;
      case 7:
switchD_001bb933_caseD_7:
        iStack_30 = 2;
LAB_001bb5a7:
        printBDAddrOperand(MI,iStack_30,O);
        return;
      case 8:
        iStack_30 = 3;
        goto LAB_001bb6bd;
      case 9:
        iStack_30 = 3;
        break;
      case 10:
        printU8ImmOperand(MI,3,O);
        SStream_concat0(O,", ");
        printU8ImmOperand(MI,4,O);
        SStream_concat0(O,", ");
        pMVar5 = MCInst_getOperand(MI,5);
        uVar6 = MCOperand_getImm(pMVar5);
        pcVar8 = ", %u";
        if (9 < (uint)uVar6) {
          pcVar8 = ", 0x%x";
        }
        SStream_concat(O,pcVar8 + 2,uVar6 & 0xffffffff);
        if (MI->csh->detail == CS_OPT_OFF) {
          return;
        }
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x16;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x1e) =
             uVar6 & 0xffffffff;
        goto LAB_001bb88b;
      default:
        goto switchD_001bb424_caseD_5;
      }
LAB_001bb5f7:
      printOperand(MI,iStack_30,O);
      return;
    case 2:
      iStack_30 = 2;
      goto LAB_001bb7d6;
    case 3:
switchD_001bb424_caseD_5:
      iStack_30 = 2;
LAB_001bb93e:
      printS16ImmOperand(MI,iStack_30,O);
      return;
    case 4:
      printOperand(MI,1,O);
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bb2e6_default;
      case 1:
        goto switchD_001bb74f_caseD_1;
      case 2:
        goto switchD_001bb74f_caseD_2;
      }
      break;
    case 5:
      iStack_30 = 2;
      goto LAB_001bb7b8;
    case 6:
      goto switchD_001bb2e6_default;
    case 7:
      printS8ImmOperand(MI,1,O);
      SStream_concat0(O,", ");
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bb2e6_default;
      case 1:
        goto switchD_001bb74f_caseD_1;
      case 2:
        goto switchD_001bb74f_caseD_2;
      }
      break;
    case 8:
      printU8ImmOperand(MI,1,O);
      SStream_concat0(O,", ");
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bb2e6_default;
      case 1:
        goto switchD_001bb74f_caseD_1;
      case 2:
        goto switchD_001bb74f_caseD_2;
      }
      break;
    case 9:
      printBDAddrOperand(MI,2,O);
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bb2e6_default;
      case 1:
        goto switchD_001bb74f_caseD_1;
      case 2:
        goto switchD_001bb74f_caseD_2;
      }
      break;
    case 10:
      printBDAddrOperand(MI,1,O);
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bb2e6_default;
      case 1:
        goto switchD_001bb74f_caseD_1;
      case 2:
        goto switchD_001bb74f_caseD_2;
      }
      break;
    case 0xb:
switchD_001bb424_caseD_3:
      iStack_30 = 1;
      goto LAB_001bb6f5;
    case 0xc:
      break;
    case 0xd:
switchD_001bb424_caseD_a:
      iStack_30 = 1;
      goto LAB_001bb6bd;
    case 0xe:
      printU4ImmOperand(MI,1,O);
      SStream_concat0(O,", ");
      printOperand(MI,2,O);
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bb2e6_default;
      case 1:
        goto switchD_001bb74f_caseD_1;
      case 2:
        goto switchD_001bb74f_caseD_2;
      }
      break;
    case 0xf:
      iStack_30 = 1;
LAB_001bb7d6:
      printS32ImmOperand(MI,iStack_30,O);
      return;
    case 0x10:
      iStack_30 = 1;
      goto LAB_001bb93e;
    case 0x11:
      goto switchD_001bb677_caseD_11;
    case 0x12:
      iStack_30 = 1;
LAB_001bb7b8:
      printU32ImmOperand(MI,iStack_30,O);
      return;
    case 0x13:
      pMVar5 = MCInst_getOperand(MI,1);
      uVar6 = MCOperand_getImm(pMVar5);
      SStream_concat(O,"%%a%u",uVar6 & 0xffffffff);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x16;
      puVar1[0] = '@';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(int *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x1e) = (int)uVar6;
LAB_001bb88b:
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
      *puVar1 = *puVar1 + '\x01';
switchD_001bb2e6_default:
      return;
    case 0x14:
switchD_001bb424_caseD_7:
      iStack_30 = 2;
      goto LAB_001bb6a2;
    case 0x15:
      iStack_30 = 1;
LAB_001bb6a2:
      printU16ImmOperand(MI,iStack_30,O);
      return;
    default:
      iStack_30 = 2;
LAB_001bb6bd:
      printBDXAddrOperand(MI,iStack_30,O);
      return;
    }
switchD_001bb677_caseD_c:
    iStack_30 = 2;
    goto LAB_001bb6f5;
  }
switchD_001bb677_caseD_11:
  SStream_concat0(O,", ");
  iStack_30 = 3;
LAB_001bb6f5:
  printPCRelOperand(MI,iStack_30,O);
  return;
}

Assistant:

void SystemZ_printInst(MCInst *MI, SStream *O, void *Info)
{
	printInstruction(MI, O, Info);
}